

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

void fct_logger_print_failures(fct_nlist_t *fail_list)

{
  size_t sVar1;
  char *__s;
  size_t idx;
  
  puts("\n----------------------------------------------------------------------------\n");
  puts("FAILED TESTS\n\n");
  if (fail_list != (fct_nlist_t *)0x0) {
    sVar1 = fail_list->used_itm_num;
    for (idx = 0; sVar1 != idx; idx = idx + 1) {
      __s = (char *)fct_nlist__at(fail_list,idx);
      puts(__s);
    }
  }
  puts("\n");
  return;
}

Assistant:

static void
fct_logger_print_failures(fct_nlist_t const *fail_list)
{
    puts(
        "\n----------------------------------------------------------------------------\n"
    );
    puts("FAILED TESTS\n\n");
    FCT_NLIST_FOREACH_BGN(char *, cndtn_str, fail_list)
    {
        printf("%s\n", cndtn_str);
    }
    FCT_NLIST_FOREACH_END();

    puts("\n");
}